

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O1

void __thiscall Timer::~Timer(Timer *this)

{
  TimeEvent *this_00;
  _Head_base<0UL,_Timer::impl_t_*,_false> _Var1;
  _Rb_tree_node_base *p_Var2;
  pointer *__ptr;
  
  for (p_Var2 = (this->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->timers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    this_00 = *(TimeEvent **)(p_Var2 + 1);
    this_00->manager = (Timer *)0x0;
    TimeEvent::~TimeEvent(this_00);
    operator_delete(this_00,0x30);
  }
  std::
  _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
  ::clear(&(this->timers)._M_t);
  std::
  _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
  ::~_Rb_tree(&(this->execlist)._M_t);
  std::
  _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
  ::~_Rb_tree(&(this->timers)._M_t);
  _Var1._M_head_impl =
       (this->impl)._M_t.super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>.
       _M_t.super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>.
       super__Head_base<0UL,_Timer::impl_t_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (impl_t *)0x0) {
    operator_delete(_Var1._M_head_impl,1);
  }
  (this->impl)._M_t.super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>._M_t.
  super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>.
  super__Head_base<0UL,_Timer::impl_t_*,_false>._M_head_impl = (impl_t *)0x0;
  return;
}

Assistant:

Timer::~Timer()
{
	UTIL_FOREACH(this->timers, timer)
	{
		timer->manager = 0;
		delete timer;
	}
	this->timers.clear();

#ifdef WIN32
	if (rres != 0)
	{
		timeEndPeriod(rres);
		rres = 0;
	}
#endif // WIN32
}